

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasEnumDefinitions(Descriptor *message_type)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  Descriptor *message_type_00;
  ulong uVar5;
  
  bVar3 = true;
  if (*(int *)(message_type + 0x74) < 1) {
    uVar5 = (ulong)*(int *)(message_type + 0x70);
    bVar3 = 0 < (long)uVar5;
    if (0 < (long)uVar5) {
      message_type_00 = *(Descriptor **)(message_type + 0x38);
      bVar2 = HasEnumDefinitions(message_type_00);
      if (!bVar2) {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          message_type_00 = message_type_00 + 0x88;
          if (uVar5 == uVar4) break;
          bVar3 = HasEnumDefinitions(message_type_00);
          uVar1 = uVar4 + 1;
        } while (!bVar3);
        bVar3 = uVar4 < uVar5;
      }
    }
  }
  return bVar3;
}

Assistant:

static bool HasEnumDefinitions(const Descriptor* message_type) {
  if (message_type->enum_type_count() > 0) return true;
  for (int i = 0; i < message_type->nested_type_count(); ++i) {
    if (HasEnumDefinitions(message_type->nested_type(i))) return true;
  }
  return false;
}